

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

shared_ptr<helics::Core>
helics::CoreFactory::create
          (CoreType type,string_view coreName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  CoreType CVar3;
  bool bVar4;
  int iVar5;
  HelicsException *this;
  undefined4 extraout_var;
  char *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  CoreType type_00;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Core> *core;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  shared_ptr<helics::Core> sVar8;
  string_view fmt;
  string_view name;
  string_view message;
  format_args args_00;
  string newName;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  core = (shared_ptr<helics::Core> *)CONCAT44(in_register_0000003c,type);
  pcVar6 = coreName._M_str;
  type_00 = (CoreType)coreName._M_len;
  paVar1 = &local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar1;
  if ((type_00 == EXTRACT) || (pcVar6 == (char *)0x0)) {
    helics::core::extractCoreType(&local_b0,in_R8);
    CVar3 = local_b0.first;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_88,&local_b0.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
      operator_delete(local_b0.second._M_dataplus._M_p,
                      local_b0.second.field_2._M_allocated_capacity + 1);
    }
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)local_88._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = CVar3;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar6;
  sVar8 = makeCore(type,name);
  peVar2 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (in_R8->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (in_R8->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (in_R8->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (in_R8->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_R8->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_R8->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*peVar2->_vptr_Core[4])
            (peVar2,&local_68,
             sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  bVar4 = registerCore(core,type_00);
  if (!bVar4) {
    this = (HelicsException *)__cxa_allocate_exception(0x28);
    iVar5 = (*((core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Core[0xc])();
    local_48 = *(undefined8 *)CONCAT44(extraout_var,iVar5);
    uStack_40 = ((undefined8 *)CONCAT44(extraout_var,iVar5))[1];
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x23;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)&local_b0,(v11 *)"core {} failed to register properly",fmt,args_00);
    message._M_str._4_4_ = local_b0._4_4_;
    message._M_str._0_4_ = local_b0.first;
    message._M_len = (size_t)local_b0.second._M_dataplus._M_p;
    HelicsException::HelicsException(this,message);
    *(undefined ***)this = &PTR__HelicsException_00515bd8;
    __cxa_throw(this,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  _Var7._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
    _Var7._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var7._M_pi
  ;
  sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)core;
  return (shared_ptr<helics::Core>)
         sVar8.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core>
    create(CoreType type, std::string_view coreName, std::vector<std::string> args)
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(args);
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }

    auto core = makeCore(type, coreName);
    core->configureFromVector(std::move(args));
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(
            fmt::format("core {} failed to register properly", core->getIdentifier())));
    }

    return core;
}